

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeDeviceGetStatus(ze_device_handle_t hDevice)

{
  ze_pfnDeviceGetStatus_t pfnGetStatus;
  ze_result_t result;
  ze_device_handle_t hDevice_local;
  
  pfnGetStatus._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c280 != (code *)0x0) {
    pfnGetStatus._4_4_ = (*DAT_0011c280)(hDevice);
  }
  return pfnGetStatus._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetStatus(
        ze_device_handle_t hDevice                      ///< [in] handle of the device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetStatus = context.zeDdiTable.Device.pfnGetStatus;
        if( nullptr != pfnGetStatus )
        {
            result = pfnGetStatus( hDevice );
        }
        else
        {
            // generic implementation
        }

        return result;
    }